

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O2

int delay_wait_for_top_right_sb(AV1_COMP *cpi)

{
  MODE MVar1;
  int iVar2;
  uint uVar3;
  
  MVar1 = (cpi->oxcf).mode;
  uVar3 = 0;
  if (MVar1 == '\x01') {
    iVar2 = is_mode_coeff_dv_upd_freq_tile_or_off(cpi);
    if (iVar2 != 0) {
      uVar3 = (uint)((cpi->sf).inter_sf.mv_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET);
    }
  }
  else if (MVar1 == '\x02') {
    iVar2 = is_mode_coeff_dv_upd_freq_tile_or_off(cpi);
    return iVar2;
  }
  return uVar3;
}

Assistant:

static inline int delay_wait_for_top_right_sb(const AV1_COMP *const cpi) {
  const MODE mode = cpi->oxcf.mode;
  if (mode == GOOD) return 0;

  if (mode == ALLINTRA)
    return is_mode_coeff_dv_upd_freq_tile_or_off(cpi);
  else if (mode == REALTIME)
    return (is_mode_coeff_dv_upd_freq_tile_or_off(cpi) &&
            cpi->sf.inter_sf.mv_cost_upd_level <= INTERNAL_COST_UPD_TILE);
  else
    return 0;
}